

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.hpp
# Opt level: O2

void __thiscall mxx::env::~env(env *this)

{
  bool bVar1;
  
  this->_vptr_env = (_func_int **)&PTR__env_001ac2c8;
  bVar1 = initialized();
  if (bVar1) {
    bVar1 = finalized();
    if (!bVar1) {
      MPI_Finalize();
    }
  }
  return;
}

Assistant:

virtual ~env() {
        if (env::initialized() && !env::finalized()) {
            MPI_Finalize();
        }
    }